

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

Vec_Ptr_t * Aig_ManCofactorBdds(Aig_Man_t *p,Vec_Ptr_t *vSubset,DdManager *dd,DdNode *bFunc)

{
  DdNode **pbVars;
  Vec_Ptr_t *pVVar1;
  void **__ptr;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  __ptr = (void **)malloc(800);
  pVVar1->pArray = __ptr;
  pbVars = (DdNode **)vSubset->pArray;
  iVar4 = 100;
  lVar3 = 0;
  while( true ) {
    iVar2 = (int)lVar3;
    if (1 << ((byte)vSubset->nSize & 0x1f) <= iVar2) break;
    n = Extra_bddBitsToCube(dd,iVar2,vSubset->nSize,pbVars,1);
    Cudd_Ref(n);
    n_00 = Cudd_Cofactor(dd,bFunc,n);
    Cudd_Ref(n_00);
    n_01 = Cudd_bddAnd(dd,n_00,n);
    Cudd_Ref(n_01);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n);
    if (iVar2 == iVar4) {
      uVar5 = (ulong)(uint)(iVar4 * 2);
      if (iVar4 < 0x10) {
        uVar5 = 0x10;
      }
      iVar2 = (int)uVar5;
      if (iVar4 < iVar2) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc(uVar5 << 3);
        }
        else {
          __ptr = (void **)realloc(__ptr,uVar5 << 3);
        }
        pVVar1->pArray = __ptr;
        pVVar1->nCap = iVar2;
        iVar4 = iVar2;
      }
    }
    __ptr[lVar3] = n_01;
    lVar3 = lVar3 + 1;
    pVVar1->nSize = (int)lVar3;
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Aig_ManCofactorBdds( Aig_Man_t * p, Vec_Ptr_t * vSubset, DdManager * dd, DdNode * bFunc )
{
    Vec_Ptr_t * vCofs;
    DdNode * bCube, * bTemp, * bCof, ** pbVars;
    int i;
    vCofs = Vec_PtrAlloc( 100 );
    pbVars = (DdNode **)Vec_PtrArray(vSubset);
    for ( i = 0; i < (1 << Vec_PtrSize(vSubset)); i++ )
    {
        bCube = Extra_bddBitsToCube( dd, i, Vec_PtrSize(vSubset), pbVars, 1 );  Cudd_Ref( bCube );
        bCof  = Cudd_Cofactor( dd, bFunc, bCube );        Cudd_Ref( bCof );
        bCof  = Cudd_bddAnd( dd, bTemp = bCof, bCube );   Cudd_Ref( bCof );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Vec_PtrPush( vCofs, bCof );
    }
    return vCofs;
}